

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereApplyPartialIndexConstraints(Expr *pTruth,int iTabCur,WhereClause *pWC)

{
  int iVar1;
  long in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  Expr *pExpr;
  WhereTerm *pTerm;
  int i;
  Expr *in_stack_ffffffffffffffc8;
  Parse *pParse;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  int iVar3;
  undefined4 in_stack_fffffffffffffff0;
  char *local_8;
  
  uVar2 = 0xaaaaaaaa;
  for (local_8 = in_RDI; *local_8 == ','; local_8 = *(char **)(local_8 + 0x18)) {
    whereApplyPartialIndexConstraints
              ((Expr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
               (WhereClause *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  }
  pParse = *(Parse **)(in_RDX + 0x20);
  for (iVar3 = 0; iVar3 < *(int *)(in_RDX + 0x14); iVar3 = iVar3 + 1) {
    if ((((ulong)pParse->pVdbe & 0x40000) == 0) &&
       (iVar1 = sqlite3ExprCompare(pParse,(Expr *)pParse->db,in_stack_ffffffffffffffc8,0),
       iVar1 == 0)) {
      *(ushort *)((long)&pParse->pVdbe + 2) = *(ushort *)((long)&pParse->pVdbe + 2) | 4;
    }
    pParse = (Parse *)&pParse->nTab;
  }
  return;
}

Assistant:

static void whereApplyPartialIndexConstraints(
  Expr *pTruth,
  int iTabCur,
  WhereClause *pWC
){
  int i;
  WhereTerm *pTerm;
  while( pTruth->op==TK_AND ){
    whereApplyPartialIndexConstraints(pTruth->pLeft, iTabCur, pWC);
    pTruth = pTruth->pRight;
  }
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    if( pTerm->wtFlags & TERM_CODED ) continue;
    pExpr = pTerm->pExpr;
    if( sqlite3ExprCompare(0, pExpr, pTruth, iTabCur)==0 ){
      pTerm->wtFlags |= TERM_CODED;
    }
  }
}